

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

Orphan<capnp::DynamicValue> * __thiscall
capnp::JsonCodec::decode
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,JsonCodec *this,Reader input,
          Type type,Orphanage orphanage)

{
  ushort uVar1;
  Orphan<capnp::DynamicValue> *pOVar2;
  Fault f;
  Fault f_4;
  double x;
  DebugComparison<unsigned_char,_double_&> _kjCondition;
  Orphan<capnp::Data> orphan;
  undefined8 *local_1b8 [6];
  undefined8 local_188;
  anon_union_8_2_eba6ea51_for_Type_5 local_180;
  BuilderArena *local_178;
  CapTableBuilder *pCStack_170;
  
  pCStack_170 = orphanage.capTable;
  local_178 = orphanage.arena;
  local_180 = type.field_4;
  local_188 = type._0_8_;
  kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::find<capnp::Type&>
            ((HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*> *)local_1b8,
             (Type *)&((this->impl).ptr)->typeHandlers);
  if (local_1b8[0] != (undefined8 *)0x0) {
    (**(code **)(*(long *)*local_1b8[0] + 8))
              (__return_storage_ptr__,(long *)*local_1b8[0],this,local_188,local_180.schema);
    return __return_storage_ptr__;
  }
  uVar1 = 0xe;
  if (local_188._2_1_ == '\0') {
    uVar1 = (ushort)local_188;
  }
  pOVar2 = (Orphan<capnp::DynamicValue> *)
           (*(code *)(&DAT_001f5e2c + *(int *)(&DAT_001f5e2c + (ulong)uVar1 * 4)))();
  return pOVar2;
}

Assistant:

Orphan<DynamicValue> JsonCodec::decode(
    JsonValue::Reader input, Type type, Orphanage orphanage) const {
  KJ_IF_SOME(handler, impl->typeHandlers.find(type)) {
    return handler->decodeBase(*this, input, type, orphanage);
  }

  switch(type.which()) {
    case schema::Type::VOID:
      return capnp::VOID;
    case schema::Type::BOOL:
      switch (input.which()) {
        case JsonValue::BOOLEAN:
          return input.getBoolean();
        default:
          KJ_FAIL_REQUIRE("Expected boolean value");
      }
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
      // Relies on range check in DynamicValue::Reader::as<IntType>
      switch (input.which()) {
        case JsonValue::NUMBER:
          return input.getNumber();
        case JsonValue::STRING:
          return input.getString().parseAs<int64_t>();
        default:
          KJ_FAIL_REQUIRE("Expected integer value");
      }
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
      // Relies on range check in DynamicValue::Reader::as<IntType>
      switch (input.which()) {
        case JsonValue::NUMBER:
          return input.getNumber();
        case JsonValue::STRING:
          return input.getString().parseAs<uint64_t>();
        default:
          KJ_FAIL_REQUIRE("Expected integer value");
      }
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
      switch (input.which()) {
        case JsonValue::NULL_:
          return kj::nan();
        case JsonValue::NUMBER:
          return input.getNumber();
        case JsonValue::STRING:
          return input.getString().parseAs<double>();
        default:
          KJ_FAIL_REQUIRE("Expected float value");
      }
    case schema::Type::TEXT:
      switch (input.which()) {
        case JsonValue::STRING:
          return orphanage.newOrphanCopy(input.getString());
        default:
          KJ_FAIL_REQUIRE("Expected text value");
      }
    case schema::Type::DATA:
      switch (input.which()) {
        case JsonValue::ARRAY: {
          auto array = input.getArray();
          auto orphan = orphanage.newOrphan<Data>(array.size());
          auto data = orphan.get();
          for (auto i: kj::indices(array)) {
            auto x = array[i].getNumber();
            KJ_REQUIRE(byte(x) == x, "Number in byte array is not an integer in [0, 255]");
            data[i] = x;
          }
          return kj::mv(orphan);
        }
        default:
          KJ_FAIL_REQUIRE("Expected data value");
      }
    case schema::Type::LIST:
      switch (input.which()) {
        case JsonValue::ARRAY:
          return decodeArray(input.getArray(), type.asList(), orphanage);
        default:
          KJ_FAIL_REQUIRE("Expected list value") { break; }
          return orphanage.newOrphan(type.asList(), 0);
      }
    case schema::Type::ENUM:
      switch (input.which()) {
        case JsonValue::STRING:
          return DynamicEnum(type.asEnum().getEnumerantByName(input.getString()));
        default:
          KJ_FAIL_REQUIRE("Expected enum value") { break; }
          return DynamicEnum(type.asEnum(), 0);
      }
    case schema::Type::STRUCT: {
      auto structType = type.asStruct();
      auto orphan = orphanage.newOrphan(structType);
      decodeObject(input, structType, orphanage, orphan.get());
      return kj::mv(orphan);
    }
    case schema::Type::INTERFACE:
      KJ_FAIL_REQUIRE("don't know how to JSON-decode capabilities; "
                      "please register a JsonCodec::Handler for this");
    case schema::Type::ANY_POINTER:
      KJ_FAIL_REQUIRE("don't know how to JSON-decode AnyPointer; "
                      "please register a JsonCodec::Handler for this");
  }

  KJ_CLANG_KNOWS_THIS_IS_UNREACHABLE_BUT_GCC_DOESNT;
}